

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotBuffer.cpp
# Opt level: O0

uchar * __thiscall cali::SnapshotBuffer::reserve(SnapshotBuffer *this,size_t min)

{
  uchar *__dest;
  uchar *tmp;
  size_t min_local;
  SnapshotBuffer *this_local;
  
  if (this->m_reserved_len < min) {
    this->m_reserved_len = min * 2 + 0x1000;
    __dest = (uchar *)operator_new__(this->m_reserved_len);
    memcpy(__dest,this->m_buffer,this->m_pos);
    if (this->m_buffer != (uchar *)0x0) {
      operator_delete__(this->m_buffer);
    }
    this->m_buffer = __dest;
    this_local = (SnapshotBuffer *)this->m_buffer;
  }
  else {
    this_local = (SnapshotBuffer *)this->m_buffer;
  }
  return (uchar *)this_local;
}

Assistant:

unsigned char* SnapshotBuffer::reserve(size_t min)
{
    if (min <= m_reserved_len)
        return m_buffer;

    m_reserved_len = 4096 + min * 2;

    unsigned char* tmp = new unsigned char[m_reserved_len];
    memcpy(tmp, m_buffer, m_pos);
    delete[] m_buffer;
    m_buffer = tmp;

    return m_buffer;
}